

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Widget::Widget(Widget *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  QArrayData *pQVar3;
  qsizetype qVar4;
  QHBoxLayout *this_00;
  PageView *this_01;
  TextLabel *pTVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QFont f;
  QTextOption opt;
  QString local_88;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QFont local_48 [16];
  uint local_38 [6];
  
  QWidget::QWidget(&this->super_QWidget,0,0);
  *(undefined ***)this = &PTR_metaObject_00190410;
  *(undefined ***)&this->field_0x10 = &PTR__Widget_001905c0;
  this_00 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_00,&this->super_QWidget);
  this_01 = (PageView *)operator_new(0x30);
  QtMWidgets::PageView::PageView(this_01,&this->super_QWidget);
  QBoxLayout::addWidget(this_00,this_01,0,0);
  pTVar5 = (TextLabel *)operator_new(0x30);
  QtMWidgets::TextLabel::TextLabel(pTVar5,(QWidget *)this_01,(WindowFlags)0x0);
  QtMWidgets::TextLabel::textOption((TextLabel *)local_38);
  local_38[0] = local_38[0] & 0xfffffe00 | 0x84;
  QFont::QFont(local_48,(QFont *)(*(long *)&pTVar5->field_0x20 + 0x38));
  QFont::setPointSize((int)local_48);
  QFont::setWeight((Weight)local_48);
  QtMWidgets::TextLabel::setTextOption(pTVar5,(QTextOption *)local_38);
  QtMWidgets::TextLabel::setFont(pTVar5,local_48);
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  local_88.d.size = 0;
  QVar6.m_data = (storage_type *)0x1;
  QVar6.m_size = (qsizetype)&local_68;
  QString::fromLatin1(QVar6);
  qVar4 = local_58;
  pQVar3 = local_68;
  pcVar2 = local_88.d.ptr;
  pDVar1 = local_88.d.d;
  local_68 = &(local_88.d.d)->super_QArrayData;
  local_88.d.d = (Data *)pQVar3;
  local_88.d.ptr = pcStack_60;
  pcStack_60 = pcVar2;
  local_58 = local_88.d.size;
  local_88.d.size = qVar4;
  if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar1->super_QArrayData,2,8);
    }
  }
  QtMWidgets::TextLabel::setText(pTVar5,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QtMWidgets::PageView::addWidget(this_01,(QWidget *)pTVar5);
  pTVar5 = (TextLabel *)operator_new(0x30);
  QtMWidgets::TextLabel::TextLabel(pTVar5,(QWidget *)this_01,(WindowFlags)0x0);
  QtMWidgets::TextLabel::setTextOption(pTVar5,(QTextOption *)local_38);
  QtMWidgets::TextLabel::setFont(pTVar5,local_48);
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  local_88.d.size = 0;
  QVar7.m_data = (storage_type *)0x1;
  QVar7.m_size = (qsizetype)&local_68;
  QString::fromLatin1(QVar7);
  qVar4 = local_58;
  pQVar3 = local_68;
  pcVar2 = local_88.d.ptr;
  pDVar1 = local_88.d.d;
  local_68 = &(local_88.d.d)->super_QArrayData;
  local_88.d.d = (Data *)pQVar3;
  local_88.d.ptr = pcStack_60;
  pcStack_60 = pcVar2;
  local_58 = local_88.d.size;
  local_88.d.size = qVar4;
  if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar1->super_QArrayData,2,8);
    }
  }
  QtMWidgets::TextLabel::setText(pTVar5,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QtMWidgets::PageView::addWidget(this_01,(QWidget *)pTVar5);
  pTVar5 = (TextLabel *)operator_new(0x30);
  QtMWidgets::TextLabel::TextLabel(pTVar5,(QWidget *)this_01,(WindowFlags)0x0);
  QtMWidgets::TextLabel::setTextOption(pTVar5,(QTextOption *)local_38);
  QtMWidgets::TextLabel::setFont(pTVar5,local_48);
  QVar8.m_data = (storage_type *)0x1;
  QVar8.m_size = (qsizetype)&local_68;
  QString::fromLatin1(QVar8);
  local_88.d.d = (Data *)local_68;
  local_88.d.ptr = pcStack_60;
  local_88.d.size = local_58;
  QtMWidgets::TextLabel::setText(pTVar5,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QtMWidgets::PageView::addWidget(this_01,(QWidget *)pTVar5);
  local_68 = (QArrayData *)0x1e000000140;
  QWidget::resize((QSize *)this);
  QFont::~QFont(local_48);
  QTextOption::~QTextOption((QTextOption *)local_38);
  return;
}

Assistant:

Widget()
	{
		QHBoxLayout * l = new QHBoxLayout( this );

		QtMWidgets::PageView * view = new QtMWidgets::PageView( this );

		l->addWidget( view );

		QtMWidgets::TextLabel * page1 = new QtMWidgets::TextLabel( view );

		QTextOption opt = page1->textOption();
		opt.setAlignment( Qt::AlignCenter );

		QFont f = page1->font();
		f.setPointSize( 150 );
		f.setBold( true );

		page1->setTextOption( opt );
		page1->setFont( f );
		page1->setText( QLatin1String( "1" ) );
		view->addWidget( page1 );

		QtMWidgets::TextLabel * page2 = new QtMWidgets::TextLabel( view );

		page2->setTextOption( opt );
		page2->setFont( f );
		page2->setText( QLatin1String( "2" ) );
		view->addWidget( page2 );

		QtMWidgets::TextLabel * page3 = new QtMWidgets::TextLabel( view );

		page3->setTextOption( opt );
		page3->setFont( f );
		page3->setText( QLatin1String( "3" ) );
		view->addWidget( page3 );

		resize( 320, 480 );
	}